

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void analyze_single_states(AV1_COMP *cpi,InterModeSearchState *search_state)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int local_84;
  long local_80;
  long local_78;
  int local_6c;
  int valid;
  int match;
  int ref_frame;
  int max_candidates;
  int count;
  SingleInterModeState *state_m;
  SingleInterModeState *state_s;
  int state_cnt_m;
  int state_cnt_s;
  int prune_factor;
  SingleInterModeState (*state) [4];
  int64_t best_rd;
  int local_20;
  int mode;
  int dir;
  int j;
  int i;
  int prune_level;
  InterModeSearchState *search_state_local;
  
  iVar2 = (cpi->sf).inter_sf.prune_comp_search_by_single_result;
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    iVar4 = 5;
    if (1 < iVar2) {
      iVar4 = 6;
    }
    lVar6 = (long)local_20;
    if (search_state->single_state[lVar6][3][0].rd < search_state->single_state[lVar6][2][0].rd) {
      local_78 = search_state->single_state[lVar6][3][0].rd;
    }
    else {
      local_78 = search_state->single_state[lVar6][2][0].rd;
    }
    for (best_rd._4_4_ = 0; best_rd._4_4_ < 4; best_rd._4_4_ = best_rd._4_4_ + 1) {
      for (dir = 1; dir < search_state->single_state_cnt[local_20][best_rd._4_4_]; dir = dir + 1) {
        if ((search_state->single_state[lVar6][best_rd._4_4_][dir].rd != 0x7fffffffffffffff) &&
           (lVar5 = (search_state->single_state[lVar6][best_rd._4_4_][dir].rd >> 3) * (long)iVar4,
           lVar5 - local_78 != 0 && local_78 <= lVar5)) {
          search_state->single_state[lVar6][best_rd._4_4_][dir].valid = 0;
        }
      }
    }
    lVar6 = (long)local_20;
    if (search_state->single_state_modelled[lVar6][3][0].rd <
        search_state->single_state_modelled[lVar6][2][0].rd) {
      local_80 = search_state->single_state_modelled[lVar6][3][0].rd;
    }
    else {
      local_80 = search_state->single_state_modelled[lVar6][2][0].rd;
    }
    for (best_rd._4_4_ = 0; best_rd._4_4_ < 4; best_rd._4_4_ = best_rd._4_4_ + 1) {
      for (dir = 1; dir < search_state->single_state_modelled_cnt[local_20][best_rd._4_4_];
          dir = dir + 1) {
        if ((search_state->single_state_modelled[lVar6][best_rd._4_4_][dir].rd != 0x7fffffffffffffff
            ) && (lVar5 = (search_state->single_state_modelled[lVar6][best_rd._4_4_][dir].rd >> 3) *
                          (long)iVar4, lVar5 - local_80 != 0 && local_80 <= lVar5)) {
          search_state->single_state_modelled[lVar6][best_rd._4_4_][dir].valid = 0;
        }
      }
    }
  }
  local_20 = 0;
  do {
    if (1 < local_20) {
      return;
    }
    for (best_rd._4_4_ = 0; best_rd._4_4_ < 4; best_rd._4_4_ = best_rd._4_4_ + 1) {
      iVar2 = search_state->single_state_cnt[local_20][best_rd._4_4_];
      iVar4 = search_state->single_state_modelled_cnt[local_20][best_rd._4_4_];
      lVar6 = (long)local_20;
      lVar5 = (long)best_rd._4_4_;
      lVar7 = (long)local_20;
      lVar8 = (long)best_rd._4_4_;
      ref_frame = 0;
      local_84 = iVar4;
      if (iVar4 < iVar2) {
        local_84 = iVar2;
      }
      dir = 0;
      while ((dir < iVar2 &&
             (search_state->single_state[lVar6][lVar5][dir].rd != 0x7fffffffffffffff))) {
        if (search_state->single_state[lVar6][lVar5][dir].valid != 0) {
          search_state->single_rd_order[local_20][best_rd._4_4_][ref_frame] =
               search_state->single_state[lVar6][lVar5][dir].ref_frame;
          ref_frame = ref_frame + 1;
        }
        dir = dir + 1;
      }
      if (ref_frame < local_84) {
        dir = 0;
        while ((dir < iVar4 && ref_frame < local_84 &&
               (search_state->single_state_modelled[lVar7][lVar8][dir].rd != 0x7fffffffffffffff))) {
          if (search_state->single_state_modelled[lVar7][lVar8][dir].valid != 0) {
            cVar1 = search_state->single_state_modelled[lVar7][lVar8][dir].ref_frame;
            bVar3 = false;
            for (mode = 0; mode < ref_frame; mode = mode + 1) {
              if (search_state->single_rd_order[local_20][best_rd._4_4_][mode] == cVar1) {
                bVar3 = true;
                break;
              }
            }
            if (!bVar3) {
              local_6c = 1;
              for (mode = 0; mode < iVar2; mode = mode + 1) {
                if (cVar1 == search_state->single_state[lVar6][lVar5][mode].ref_frame) {
                  local_6c = search_state->single_state[lVar6][lVar5][mode].valid;
                  break;
                }
              }
              if (local_6c != 0) {
                search_state->single_rd_order[local_20][best_rd._4_4_][ref_frame] = cVar1;
                ref_frame = ref_frame + 1;
              }
            }
          }
          dir = dir + 1;
        }
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static inline void analyze_single_states(const AV1_COMP *cpi,
                                         InterModeSearchState *search_state) {
  const int prune_level = cpi->sf.inter_sf.prune_comp_search_by_single_result;
  assert(prune_level >= 1);
  int i, j, dir, mode;

  for (dir = 0; dir < 2; ++dir) {
    int64_t best_rd;
    SingleInterModeState(*state)[FWD_REFS];
    const int prune_factor = prune_level >= 2 ? 6 : 5;

    // Use the best rd of GLOBALMV or NEWMV to prune the unlikely
    // reference frames for all the modes (NEARESTMV and NEARMV may not
    // have same motion vectors). Always keep the best of each mode
    // because it might form the best possible combination with other mode.
    state = search_state->single_state[dir];
    best_rd = AOMMIN(state[INTER_OFFSET(NEWMV)][0].rd,
                     state[INTER_OFFSET(GLOBALMV)][0].rd);
    for (mode = 0; mode < SINGLE_INTER_MODE_NUM; ++mode) {
      for (i = 1; i < search_state->single_state_cnt[dir][mode]; ++i) {
        if (state[mode][i].rd != INT64_MAX &&
            (state[mode][i].rd >> 3) * prune_factor > best_rd) {
          state[mode][i].valid = 0;
        }
      }
    }

    state = search_state->single_state_modelled[dir];
    best_rd = AOMMIN(state[INTER_OFFSET(NEWMV)][0].rd,
                     state[INTER_OFFSET(GLOBALMV)][0].rd);
    for (mode = 0; mode < SINGLE_INTER_MODE_NUM; ++mode) {
      for (i = 1; i < search_state->single_state_modelled_cnt[dir][mode]; ++i) {
        if (state[mode][i].rd != INT64_MAX &&
            (state[mode][i].rd >> 3) * prune_factor > best_rd) {
          state[mode][i].valid = 0;
        }
      }
    }
  }

  // Ordering by simple rd first, then by modelled rd
  for (dir = 0; dir < 2; ++dir) {
    for (mode = 0; mode < SINGLE_INTER_MODE_NUM; ++mode) {
      const int state_cnt_s = search_state->single_state_cnt[dir][mode];
      const int state_cnt_m =
          search_state->single_state_modelled_cnt[dir][mode];
      SingleInterModeState *state_s = search_state->single_state[dir][mode];
      SingleInterModeState *state_m =
          search_state->single_state_modelled[dir][mode];
      int count = 0;
      const int max_candidates = AOMMAX(state_cnt_s, state_cnt_m);
      for (i = 0; i < state_cnt_s; ++i) {
        if (state_s[i].rd == INT64_MAX) break;
        if (state_s[i].valid) {
          search_state->single_rd_order[dir][mode][count++] =
              state_s[i].ref_frame;
        }
      }
      if (count >= max_candidates) continue;

      for (i = 0; i < state_cnt_m && count < max_candidates; ++i) {
        if (state_m[i].rd == INT64_MAX) break;
        if (!state_m[i].valid) continue;
        const int ref_frame = state_m[i].ref_frame;
        int match = 0;
        // Check if existing already
        for (j = 0; j < count; ++j) {
          if (search_state->single_rd_order[dir][mode][j] == ref_frame) {
            match = 1;
            break;
          }
        }
        if (match) continue;
        // Check if this ref_frame is removed in simple rd
        int valid = 1;
        for (j = 0; j < state_cnt_s; ++j) {
          if (ref_frame == state_s[j].ref_frame) {
            valid = state_s[j].valid;
            break;
          }
        }
        if (valid) {
          search_state->single_rd_order[dir][mode][count++] = ref_frame;
        }
      }
    }
  }
}